

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_game.cpp
# Opt level: O0

void ChangeSpy(int changespy)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  AActor *pAVar4;
  bool bVar5;
  int step;
  player_t *player;
  int pnum;
  bool checkTeam;
  int changespy_local;
  
  if (gamestate == GS_LEVEL) {
    pAVar4 = TObjPtr<AActor>::operator->
                       ((TObjPtr<AActor> *)(&DAT_01ae7238 + (long)consoleplayer * 0x2a0));
    if (pAVar4->player == (player_t *)0x0) {
      if ((demoplayback & 1U) == 0) {
        Net_WriteByte('B');
      }
    }
    else {
      uVar2 = FIntCVar::operator_cast_to_int(&dmflags2);
      if ((uVar2 & 0x100000) == 0) {
        bVar5 = false;
        if ((demoplayback & 1U) == 0) {
          iVar3 = FIntCVar::operator_cast_to_int(&deathmatch);
          bVar5 = iVar3 != 0;
        }
        player._4_4_ = consoleplayer;
        if (changespy != 0) {
          pAVar4 = TObjPtr<AActor>::operator->
                             ((TObjPtr<AActor> *)(&DAT_01ae7238 + (long)consoleplayer * 0x2a0));
          if (pAVar4->player != (player_t *)0x0) {
            pAVar4 = TObjPtr<AActor>::operator->
                               ((TObjPtr<AActor> *)(&DAT_01ae7238 + (long)consoleplayer * 0x2a0));
            player._4_4_ = (uint)((long)(pAVar4->player[-0xa3fb].weapons.Slots + 4) / 0x2a0);
          }
          iVar3 = -1;
          if (changespy == 1) {
            iVar3 = 1;
          }
          do {
            player._4_4_ = iVar3 + player._4_4_ & 7;
            if (((playeringame[(int)player._4_4_] & 1U) != 0) &&
               (((!bVar5 ||
                 (bVar1 = AActor::IsTeammate((AActor *)(&players)[(long)(int)player._4_4_ * 0x54],
                                             (AActor *)(&players)[(long)consoleplayer * 0x54]),
                 bVar1)) ||
                ((bVar1 = FBoolCVar::operator_cast_to_bool(&bot_allowspy), bVar1 &&
                 (bVar1 = TObjPtr<DBot>::operator!=
                                    ((TObjPtr<DBot> *)
                                     (&DAT_01ae7258 + (long)(int)player._4_4_ * 0x2a0),(DBot *)0x0),
                 bVar1)))))) break;
          } while (player._4_4_ != consoleplayer);
        }
        TObjPtr<AActor>::operator=
                  ((TObjPtr<AActor> *)(&DAT_01ae7238 + (long)consoleplayer * 0x2a0),
                   (AActor *)(&players)[(long)(int)player._4_4_ * 0x54]);
        pAVar4 = TObjPtr::operator_cast_to_AActor_
                           ((TObjPtr *)(&DAT_01ae7238 + (long)consoleplayer * 0x2a0));
        S_UpdateSounds(pAVar4);
        (*(StatusBar->super_DObject)._vptr_DObject[10])
                  (StatusBar,&players + (long)(int)player._4_4_ * 0x54);
        if (((demoplayback & 1U) != 0) || ((multiplayer & 1U) != 0)) {
          DBaseStatusBar::ShowPlayerName(StatusBar);
        }
      }
    }
  }
  return;
}

Assistant:

static void ChangeSpy (int changespy)
{
	// If you're not in a level, then you can't spy.
	if (gamestate != GS_LEVEL)
	{
		return;
	}

	// If not viewing through a player, return your eyes to your own head.
	if (players[consoleplayer].camera->player == NULL)
	{
		// When watching demos, you will just have to wait until your player
		// has done this for you, since it could desync otherwise.
		if (!demoplayback)
		{
			Net_WriteByte(DEM_REVERTCAMERA);
		}
		return;
	}

	// We may not be allowed to spy on anyone.
	if (dmflags2 & DF2_DISALLOW_SPYING)
		return;

	// Otherwise, cycle to the next player.
	bool checkTeam = !demoplayback && deathmatch;
	int pnum = consoleplayer;
	if (changespy != SPY_CANCEL) 
	{
		player_t *player = players[consoleplayer].camera->player;
		// only use the camera as starting index if it's a valid player.
		if (player != NULL) pnum = int(players[consoleplayer].camera->player - players);

		int step = (changespy == SPY_NEXT) ? 1 : -1;

		do
		{
			pnum += step;
			pnum &= MAXPLAYERS-1;
			if (playeringame[pnum] &&
				(!checkTeam || players[pnum].mo->IsTeammate (players[consoleplayer].mo) ||
				(bot_allowspy && players[pnum].Bot != NULL)))
			{
				break;
			}
		} while (pnum != consoleplayer);
	}

	players[consoleplayer].camera = players[pnum].mo;
	S_UpdateSounds(players[consoleplayer].camera);
	StatusBar->AttachToPlayer (&players[pnum]);
	if (demoplayback || multiplayer)
	{
		StatusBar->ShowPlayerName ();
	}
}